

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void ConstructDefaultFilename(path *dest,char *ext,bool checkIfDestIsEmpty)

{
  pointer __source;
  char *ext_local;
  path local_38;
  
  ext_local = ext;
  if ((ext == (char *)0x0) || (*ext == '\0')) {
    exit(1);
  }
  if ((!checkIfDestIsEmpty) || ((dest->_M_pathname)._M_string_length == 0)) {
    std::filesystem::__cxx11::path::operator=(dest,(char (*) [4])"asm");
    for (__source = sourceFiles.super__Vector_base<SSource,_std::allocator<SSource>_>._M_impl.
                    super__Vector_impl_data._M_start;
        __source !=
        sourceFiles.super__Vector_base<SSource,_std::allocator<SSource>_>._M_impl.
        super__Vector_impl_data._M_finish; __source = __source + 1) {
      if (__source->fname[0] != '\0') {
        std::filesystem::__cxx11::path::operator=(dest,__source->fname);
        break;
      }
    }
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_38,&ext_local,auto_format);
    std::filesystem::__cxx11::path::replace_extension(dest);
    std::filesystem::__cxx11::path::~path(&local_38);
  }
  return;
}

Assistant:

void ConstructDefaultFilename(std::filesystem::path & dest, const char* ext, bool checkIfDestIsEmpty) {
	if (nullptr == ext || !ext[0]) exit(1);	// invalid arguments
	// if the destination buffer has already some content and check is requested, exit
	if (checkIfDestIsEmpty && !dest.empty()) return;
	// construct the new default name - search for explicit name in sourcefiles
	dest = "asm";		// use "asm" base if no explicit filename available
	for (const SSource & src : sourceFiles) {
		if (!src.fname[0]) continue;
		dest = src.fname;
		break;
	}
	dest.replace_extension(ext);
}